

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> * __thiscall
QPDFPageObjectHelper::getAnnotations
          (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           *__return_storage_ptr__,QPDFPageObjectHelper *this,string *only_subtype)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  QPDFObjectHandle annot;
  int i;
  int nannots;
  QPDFObjectHandle annots;
  string *only_subtype_local;
  QPDFPageObjectHelper *this_local;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *result;
  
  annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 0;
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::vector
            (__return_storage_ptr__);
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nannots,"/Annots",(allocator<char> *)((long)&i + 3));
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&stack0xffffffffffffffc8,(string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&nannots);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffb8);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&stack0xffffffffffffffc8);
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&stack0xffffffffffffffc8);
    for (annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_ = 0;
        annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ < iVar2;
        annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_ + 1) {
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_98,(int)&stack0xffffffffffffffc8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
      bVar1 = QPDFObjectHandle::isDictionaryOfType
                        ((QPDFObjectHandle *)local_98,&local_b8,only_subtype);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      if (bVar1) {
        std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
        emplace_back<QPDFObjectHandle&>
                  ((vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *)
                   __return_storage_ptr__,(QPDFObjectHandle *)local_98);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_98);
    }
  }
  annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffc8);
  if ((annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFAnnotationObjectHelper>
QPDFPageObjectHelper::getAnnotations(std::string const& only_subtype)
{
    std::vector<QPDFAnnotationObjectHelper> result;
    QPDFObjectHandle annots = oh().getKey("/Annots");
    if (annots.isArray()) {
        int nannots = annots.getArrayNItems();
        for (int i = 0; i < nannots; ++i) {
            QPDFObjectHandle annot = annots.getArrayItem(i);
            if (annot.isDictionaryOfType("", only_subtype)) {
                result.emplace_back(annot);
            }
        }
    }
    return result;
}